

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionSlider::QStyleOptionSlider(QStyleOptionSlider *this,int version)

{
  QStyleOptionComplex *in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  QStyleOptionComplex::QStyleOptionComplex
            (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  in_RDI[1].super_QStyleOption.version = 1;
  in_RDI[1].super_QStyleOption.type = 0;
  in_RDI[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  in_RDI[1].super_QStyleOption.direction = LeftToRight;
  in_RDI[1].super_QStyleOption.rect.x1.m_i = 0;
  *(undefined1 *)&in_RDI[1].super_QStyleOption.rect.y1.m_i = 0;
  in_RDI[1].super_QStyleOption.rect.x2.m_i = 0;
  in_RDI[1].super_QStyleOption.rect.y2.m_i = 0;
  *(undefined4 *)&in_RDI[1].super_QStyleOption.fontMetrics = 0;
  *(undefined4 *)&in_RDI[1].super_QStyleOption.field_0x24 = 0;
  in_RDI[1].super_QStyleOption.palette.d = (QPalettePrivate *)0x0;
  *(undefined1 *)&in_RDI[1].super_QStyleOption.palette.currentGroup = Active;
  memset(&in_RDI[1].super_QStyleOption.palette.field_0xc,0,4);
  QFlags<Qt::KeyboardModifier>::QFlags((QFlags<Qt::KeyboardModifier> *)0x41d3ec);
  return;
}

Assistant:

QStyleOptionSlider::QStyleOptionSlider(int version)
    : QStyleOptionComplex(version, SO_Slider), orientation(Qt::Horizontal), minimum(0), maximum(0),
      tickPosition(QSlider::NoTicks), tickInterval(0), upsideDown(false),
      sliderPosition(0), sliderValue(0), singleStep(0), pageStep(0), notchTarget(0.0),
      dialWrapping(false), keyboardModifiers{}
{
}